

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jaccard.cpp
# Opt level: O1

void duckdb::JaccardFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  ulong *puVar1;
  VectorType VVar2;
  VectorType VVar3;
  unsigned_long *puVar4;
  double *pdVar5;
  data_ptr_t pdVar6;
  data_ptr_t pdVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  sel_t *psVar10;
  sel_t *psVar11;
  anon_class_8_1_6971b95b aVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar13;
  double dVar14;
  element_type *peVar15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var16;
  reference vector;
  reference vector_00;
  idx_t iVar17;
  TemplatedValidityData<unsigned_long> *pTVar18;
  ulong uVar19;
  idx_t iVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  idx_t iVar24;
  long lVar25;
  idx_t count;
  undefined8 in_R8;
  ValidityMask *in_R9;
  idx_t idx_in_entry;
  data_ptr_t pdVar26;
  unsigned_long uVar27;
  string_t left;
  string_t left_00;
  string_t left_01;
  string_t left_02;
  string_t left_03;
  string_t left_04;
  string_t left_05;
  string_t left_06;
  string_t left_07;
  string_t left_08;
  string_t left_09;
  string_t left_10;
  string_t right;
  string_t right_00;
  string_t right_01;
  string_t right_02;
  string_t right_03;
  string_t right_04;
  string_t right_05;
  string_t right_06;
  string_t right_07;
  string_t right_08;
  string_t right_09;
  string_t right_10;
  UnifiedVectorFormat ldata;
  idx_t in_stack_fffffffffffffee8;
  data_ptr_t local_110;
  element_type *local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_d0;
  idx_t local_c8;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  vector = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  vector_00 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  VVar2 = vector->vector_type;
  VVar3 = vector_00->vector_type;
  if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar4 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    pdVar5 = (double *)result->data;
    if (((puVar4 == (unsigned_long *)0x0) || ((*puVar4 & 1) != 0)) &&
       ((puVar4 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar4 == (unsigned_long *)0x0 || ((*puVar4 & 1) != 0)))) {
      left.value.pointer.ptr = (char *)*(undefined8 *)vector_00->data;
      left.value._0_8_ = *(undefined8 *)(vector->data + 8);
      right.value.pointer.ptr = (char *)in_R8;
      right.value._0_8_ = *(undefined8 *)(vector_00->data + 8);
      dVar14 = BinaryLambdaWrapper::
               Operation<duckdb::JaccardFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,double>
                         (*(Vector **)vector->data,left,right,in_R9,in_stack_fffffffffffffee8);
      *pdVar5 = dVar14;
      return;
    }
  }
  else {
    count = args->count;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar2 == FLAT_VECTOR) {
      local_110 = vector->data;
      pdVar6 = vector_00->data;
      puVar4 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar4 == (unsigned_long *)0x0) || ((*puVar4 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar7 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::VerifyFlatVector(result);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (count == 0) {
            return;
          }
          uVar8 = *(undefined8 *)pdVar6;
          uVar9 = *(undefined8 *)(pdVar6 + 8);
          local_110 = local_110 + 8;
          iVar24 = 0;
          do {
            left_05.value.pointer.ptr = (char *)uVar8;
            left_05.value._0_8_ = *(undefined8 *)local_110;
            right_05.value.pointer.ptr = (char *)in_R8;
            right_05.value._0_8_ = uVar9;
            dVar14 = BinaryLambdaWrapper::
                     Operation<duckdb::JaccardFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,double>
                               (*(Vector **)(local_110 + -8),left_05,right_05,in_R9,
                                in_stack_fffffffffffffee8);
            *(double *)(pdVar7 + iVar24 * 8) = dVar14;
            iVar24 = iVar24 + 1;
            local_110 = local_110 + 0x10;
          } while (count != iVar24);
          return;
        }
        if (count + 0x3f < 0x40) {
          return;
        }
        uVar19 = 0;
        uVar23 = 0;
        do {
          puVar4 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar4 == (unsigned_long *)0x0) {
            uVar27 = 0xffffffffffffffff;
          }
          else {
            uVar27 = puVar4[uVar19];
          }
          uVar21 = uVar23 + 0x40;
          if (count <= uVar23 + 0x40) {
            uVar21 = count;
          }
          uVar22 = uVar21;
          if (uVar27 != 0) {
            uVar22 = uVar23;
            if (uVar27 == 0xffffffffffffffff) {
              if (uVar23 < uVar21) {
                uVar8 = *(undefined8 *)pdVar6;
                uVar9 = *(undefined8 *)(pdVar6 + 8);
                pdVar26 = local_110 + uVar23 * 0x10 + 8;
                do {
                  left_00.value.pointer.ptr = (char *)uVar8;
                  left_00.value._0_8_ = *(undefined8 *)pdVar26;
                  right_00.value.pointer.ptr = (char *)in_R8;
                  right_00.value._0_8_ = uVar9;
                  dVar14 = BinaryLambdaWrapper::
                           Operation<duckdb::JaccardFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,double>
                                     (*(Vector **)(pdVar26 + -8),left_00,right_00,in_R9,
                                      in_stack_fffffffffffffee8);
                  *(double *)(pdVar7 + uVar22 * 8) = dVar14;
                  uVar22 = uVar22 + 1;
                  pdVar26 = pdVar26 + 0x10;
                } while (uVar21 != uVar22);
              }
            }
            else if (uVar23 < uVar21) {
              pdVar26 = local_110 + uVar23 * 0x10 + 8;
              uVar22 = 0;
              do {
                if ((uVar27 >> (uVar22 & 0x3f) & 1) != 0) {
                  left_01.value.pointer.ptr = (char *)*(undefined8 *)pdVar6;
                  left_01.value._0_8_ = *(undefined8 *)pdVar26;
                  right_01.value.pointer.ptr = (char *)in_R8;
                  right_01.value._0_8_ = *(undefined8 *)(pdVar6 + 8);
                  dVar14 = BinaryLambdaWrapper::
                           Operation<duckdb::JaccardFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,double>
                                     (*(Vector **)(pdVar26 + -8),left_01,right_01,in_R9,
                                      in_stack_fffffffffffffee8);
                  *(double *)(pdVar7 + uVar22 * 8 + uVar23 * 8) = dVar14;
                }
                uVar22 = uVar22 + 1;
                pdVar26 = pdVar26 + 0x10;
              } while ((uVar23 - uVar21) + uVar22 != 0);
              uVar22 = uVar23 + uVar22;
            }
          }
          uVar19 = uVar19 + 1;
          uVar23 = uVar22;
        } while (uVar19 != count + 0x3f >> 6);
        return;
      }
    }
    else {
      if ((VVar2 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar2 == FLAT_VECTOR) {
          pdVar6 = vector->data;
          pdVar7 = vector_00->data;
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar26 = result->data;
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vector);
          FlatVector::VerifyFlatVector(result);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                     &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
               (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          FlatVector::VerifyFlatVector(vector_00);
          ValidityMask::Combine(&result->validity,&vector_00->validity,count);
          if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (count != 0) {
              lVar25 = 0;
              do {
                left_10.value.pointer.ptr = (char *)*(undefined8 *)(pdVar7 + lVar25 * 2);
                left_10.value._0_8_ = *(undefined8 *)(pdVar6 + lVar25 * 2 + 8);
                right_10.value.pointer.ptr = (char *)in_R8;
                right_10.value._0_8_ = *(undefined8 *)(pdVar7 + lVar25 * 2 + 8);
                dVar14 = BinaryLambdaWrapper::
                         Operation<duckdb::JaccardFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,double>
                                   (*(Vector **)(pdVar6 + lVar25 * 2),left_10,right_10,in_R9,
                                    in_stack_fffffffffffffee8);
                *(double *)(pdVar26 + lVar25) = dVar14;
                lVar25 = lVar25 + 8;
                count = count - 1;
              } while (count != 0);
            }
          }
          else if (0x3f < count + 0x3f) {
            uVar19 = 0;
            uVar23 = 0;
            do {
              puVar4 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar4 == (unsigned_long *)0x0) {
                uVar27 = 0xffffffffffffffff;
              }
              else {
                uVar27 = puVar4[uVar19];
              }
              uVar21 = uVar23 + 0x40;
              if (count <= uVar23 + 0x40) {
                uVar21 = count;
              }
              uVar22 = uVar21;
              if (uVar27 != 0) {
                uVar22 = uVar23;
                if (uVar27 == 0xffffffffffffffff) {
                  if (uVar23 < uVar21) {
                    lVar25 = uVar23 * 2 + 1;
                    do {
                      left_06.value.pointer.ptr = (char *)*(undefined8 *)(pdVar7 + lVar25 * 8 + -8);
                      left_06.value._0_8_ = *(undefined8 *)(pdVar6 + lVar25 * 8);
                      right_06.value.pointer.ptr = (char *)in_R8;
                      right_06.value._0_8_ = *(undefined8 *)(pdVar7 + lVar25 * 8);
                      dVar14 = BinaryLambdaWrapper::
                               Operation<duckdb::JaccardFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,double>
                                         (*(Vector **)(pdVar6 + lVar25 * 8 + -8),left_06,right_06,
                                          in_R9,in_stack_fffffffffffffee8);
                      *(double *)(pdVar26 + uVar23 * 8) = dVar14;
                      uVar23 = uVar23 + 1;
                      lVar25 = lVar25 + 2;
                      uVar22 = uVar23;
                    } while (uVar21 != uVar23);
                  }
                }
                else if (uVar23 < uVar21) {
                  lVar25 = uVar23 * 2 + 1;
                  uVar22 = 0;
                  do {
                    if ((uVar27 >> (uVar22 & 0x3f) & 1) != 0) {
                      left_07.value.pointer.ptr = (char *)*(undefined8 *)(pdVar7 + lVar25 * 8 + -8);
                      left_07.value._0_8_ = *(undefined8 *)(pdVar6 + lVar25 * 8);
                      right_07.value.pointer.ptr = (char *)in_R8;
                      right_07.value._0_8_ = *(undefined8 *)(pdVar7 + lVar25 * 8);
                      dVar14 = BinaryLambdaWrapper::
                               Operation<duckdb::JaccardFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,double>
                                         (*(Vector **)(pdVar6 + lVar25 * 8 + -8),left_07,right_07,
                                          in_R9,in_stack_fffffffffffffee8);
                      *(double *)(pdVar26 + uVar22 * 8 + uVar23 * 8) = dVar14;
                    }
                    uVar22 = uVar22 + 1;
                    lVar25 = lVar25 + 2;
                  } while ((uVar23 - uVar21) + uVar22 != 0);
                  uVar22 = uVar23 + uVar22;
                }
              }
              uVar19 = uVar19 + 1;
              uVar23 = uVar22;
            } while (uVar19 != count + 0x3f >> 6);
          }
        }
        else {
          UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
          Vector::ToUnifiedFormat(vector,count,&local_78);
          Vector::ToUnifiedFormat(vector_00,count,&local_c0);
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar6 = result->data;
          FlatVector::VerifyFlatVector(result);
          if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 &&
              local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (count != 0) {
              psVar10 = (local_78.sel)->sel_vector;
              psVar11 = (local_c0.sel)->sel_vector;
              iVar24 = 0;
              do {
                iVar17 = iVar24;
                if (psVar10 != (sel_t *)0x0) {
                  iVar17 = (idx_t)psVar10[iVar24];
                }
                iVar20 = iVar24;
                if (psVar11 != (sel_t *)0x0) {
                  iVar20 = (idx_t)psVar11[iVar24];
                }
                left_02.value.pointer.ptr = (char *)*(undefined8 *)(local_c0.data + iVar20 * 0x10);
                left_02.value._0_8_ = *(undefined8 *)(local_78.data + iVar17 * 0x10 + 8);
                right_02.value.pointer.ptr = (char *)in_R8;
                right_02.value._0_8_ = *(undefined8 *)(local_c0.data + iVar20 * 0x10 + 8);
                dVar14 = BinaryLambdaWrapper::
                         Operation<duckdb::JaccardFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,double>
                                   (*(Vector **)(local_78.data + iVar17 * 0x10),left_02,right_02,
                                    in_R9,in_stack_fffffffffffffee8);
                *(double *)(pdVar6 + iVar24 * 8) = dVar14;
                iVar24 = iVar24 + 1;
              } while (count != iVar24);
            }
          }
          else if (count != 0) {
            psVar10 = (local_78.sel)->sel_vector;
            psVar11 = (local_c0.sel)->sel_vector;
            uVar23 = 0;
            do {
              uVar19 = uVar23;
              if (psVar10 != (sel_t *)0x0) {
                uVar19 = (ulong)psVar10[uVar23];
              }
              uVar21 = uVar23;
              if (psVar11 != (sel_t *)0x0) {
                uVar21 = (ulong)psVar11[uVar23];
              }
              if (((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) ||
                  ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar19 >> 6] >> (uVar19 & 0x3f) & 1) != 0)) &&
                 ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0 ||
                  ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar21 >> 6] >> (uVar21 & 0x3f) & 1) != 0)))) {
                left_08.value.pointer.ptr = (char *)*(undefined8 *)(local_c0.data + uVar21 * 0x10);
                left_08.value._0_8_ = *(undefined8 *)(local_78.data + uVar19 * 0x10 + 8);
                right_08.value.pointer.ptr = (char *)in_R8;
                right_08.value._0_8_ = *(undefined8 *)(local_c0.data + uVar21 * 0x10 + 8);
                dVar14 = BinaryLambdaWrapper::
                         Operation<duckdb::JaccardFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,double>
                                   (*(Vector **)(local_78.data + uVar19 * 0x10),left_08,right_08,
                                    in_R9,in_stack_fffffffffffffee8);
                *(double *)(pdVar6 + uVar23 * 8) = dVar14;
              }
              else {
                if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) {
                  local_c8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_d8,&local_c8);
                  p_Var16 = p_Stack_d0;
                  peVar15 = local_d8;
                  local_d8 = (element_type *)0x0;
                  p_Stack_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data
                         .internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = peVar15;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = p_Var16;
                  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
                  }
                  if (p_Stack_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_d0);
                  }
                  pTVar18 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->(&(result->validity).
                                        super_TemplatedValidityMask<unsigned_long>.validity_data);
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       (unsigned_long *)
                       (pTVar18->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>;
                }
                bVar13 = (byte)uVar23 & 0x3f;
                puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
                         + (uVar23 >> 6);
                *puVar1 = *puVar1 & (-2L << bVar13 | 0xfffffffffffffffeU >> 0x40 - bVar13);
              }
              uVar23 = uVar23 + 1;
            } while (count != uVar23);
          }
          if (local_c0.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c0.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (local_78.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_78.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
        }
        return;
      }
      pdVar6 = vector->data;
      puVar4 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      local_110 = vector_00->data;
      if ((puVar4 == (unsigned_long *)0x0) || ((*puVar4 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar7 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector_00);
        FlatVector::VerifyFlatVector(result);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (count == 0) {
            return;
          }
          aVar12.result = *(Vector **)pdVar6;
          uVar8 = *(undefined8 *)(pdVar6 + 8);
          local_110 = local_110 + 8;
          iVar24 = 0;
          do {
            left_09.value.pointer.ptr = (char *)*(undefined8 *)(local_110 + -8);
            left_09.value._0_8_ = uVar8;
            right_09.value.pointer.ptr = (char *)in_R8;
            right_09.value._0_8_ = *(undefined8 *)local_110;
            dVar14 = BinaryLambdaWrapper::
                     Operation<duckdb::JaccardFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,double>
                               (aVar12,left_09,right_09,in_R9,in_stack_fffffffffffffee8);
            *(double *)(pdVar7 + iVar24 * 8) = dVar14;
            iVar24 = iVar24 + 1;
            local_110 = local_110 + 0x10;
          } while (count != iVar24);
          return;
        }
        if (count + 0x3f < 0x40) {
          return;
        }
        uVar19 = 0;
        uVar23 = 0;
        do {
          puVar4 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar4 == (unsigned_long *)0x0) {
            uVar27 = 0xffffffffffffffff;
          }
          else {
            uVar27 = puVar4[uVar19];
          }
          uVar21 = uVar23 + 0x40;
          if (count <= uVar23 + 0x40) {
            uVar21 = count;
          }
          uVar22 = uVar21;
          if (uVar27 != 0) {
            uVar22 = uVar23;
            if (uVar27 == 0xffffffffffffffff) {
              if (uVar23 < uVar21) {
                aVar12.result = *(Vector **)pdVar6;
                uVar8 = *(undefined8 *)(pdVar6 + 8);
                pdVar26 = local_110 + uVar23 * 0x10 + 8;
                do {
                  left_03.value.pointer.ptr = (char *)*(undefined8 *)(pdVar26 + -8);
                  left_03.value._0_8_ = uVar8;
                  right_03.value.pointer.ptr = (char *)in_R8;
                  right_03.value._0_8_ = *(undefined8 *)pdVar26;
                  dVar14 = BinaryLambdaWrapper::
                           Operation<duckdb::JaccardFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,double>
                                     (aVar12,left_03,right_03,in_R9,in_stack_fffffffffffffee8);
                  *(double *)(pdVar7 + uVar23 * 8) = dVar14;
                  uVar23 = uVar23 + 1;
                  pdVar26 = pdVar26 + 0x10;
                  uVar22 = uVar23;
                } while (uVar21 != uVar23);
              }
            }
            else if (uVar23 < uVar21) {
              pdVar26 = local_110 + uVar23 * 0x10 + 8;
              uVar22 = 0;
              do {
                if ((uVar27 >> (uVar22 & 0x3f) & 1) != 0) {
                  left_04.value.pointer.ptr = (char *)*(undefined8 *)(pdVar26 + -8);
                  left_04.value._0_8_ = *(undefined8 *)(pdVar6 + 8);
                  right_04.value.pointer.ptr = (char *)in_R8;
                  right_04.value._0_8_ = *(undefined8 *)pdVar26;
                  dVar14 = BinaryLambdaWrapper::
                           Operation<duckdb::JaccardFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,double>
                                     (*(Vector **)pdVar6,left_04,right_04,in_R9,
                                      in_stack_fffffffffffffee8);
                  *(double *)(pdVar7 + uVar22 * 8 + uVar23 * 8) = dVar14;
                }
                uVar22 = uVar22 + 1;
                pdVar26 = pdVar26 + 0x10;
              } while ((uVar23 - uVar21) + uVar22 != 0);
              uVar22 = uVar23 + uVar22;
            }
          }
          uVar19 = uVar19 + 1;
          uVar23 = uVar22;
        } while (uVar19 != count + 0x3f >> 6);
        return;
      }
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void JaccardFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &str_vec = args.data[0];
	auto &tgt_vec = args.data[1];

	BinaryExecutor::Execute<string_t, string_t, double>(
	    str_vec, tgt_vec, result, args.size(),
	    [&](string_t str, string_t tgt) { return JaccardScalarFunction(result, str, tgt); });
}